

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall flatbuffers::EnumVal::Deserialize(EnumVal *this,Parser *parser,EnumVal *val)

{
  EnumVal *pEVar1;
  bool bVar2;
  String *this_00;
  int64_t iVar3;
  Type *type;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  string local_48;
  EnumVal *local_28;
  EnumVal *val_local;
  Parser *parser_local;
  EnumVal *this_local;
  
  local_28 = val;
  val_local = (EnumVal *)parser;
  parser_local = (Parser *)this;
  this_00 = reflection::EnumVal::name(val);
  String::str_abi_cxx11_(&local_48,this_00);
  std::__cxx11::string::operator=((string *)this,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  iVar3 = reflection::EnumVal::value(local_28);
  pEVar1 = val_local;
  this->value = iVar3;
  type = reflection::EnumVal::union_type(local_28);
  bVar2 = Type::Deserialize(&this->union_type,(Parser *)pEVar1,type);
  pEVar1 = val_local;
  if (bVar2) {
    attrs = reflection::EnumVal::attributes(local_28);
    bVar2 = DeserializeAttributes(this,(Parser *)pEVar1,attrs);
    if (bVar2) {
      documentation = reflection::EnumVal::documentation(local_28);
      anon_unknown_0::DeserializeDoc(&this->doc_comment,documentation);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EnumVal::Deserialize(Parser &parser, const reflection::EnumVal *val) {
  name = val->name()->str();
  value = val->value();
  if (!union_type.Deserialize(parser, val->union_type())) return false;
  if (!DeserializeAttributes(parser, val->attributes())) return false;
  DeserializeDoc(doc_comment, val->documentation());
  return true;
}